

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAXParseException.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::SAXParseException::SAXParseException
          (SAXParseException *this,XMLCh *message,Locator *locator,MemoryManager *manager)

{
  short *psVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  void *pvVar4;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  size_t sVar5;
  XMLCh *pXVar3;
  undefined4 extraout_var_02;
  
  (this->super_SAXException)._vptr_SAXException = (_func_int **)&PTR__SAXException_0040b520;
  if (message == (XMLCh *)0x0) {
    pXVar3 = (XMLCh *)0x0;
  }
  else {
    sVar5 = 0;
    do {
      psVar1 = (short *)((long)message + sVar5);
      sVar5 = sVar5 + 2;
    } while (*psVar1 != 0);
    iVar2 = (*manager->_vptr_MemoryManager[3])(manager,sVar5);
    pXVar3 = (XMLCh *)CONCAT44(extraout_var,iVar2);
    memcpy(pXVar3,message,sVar5);
  }
  (this->super_SAXException).fMsg = pXVar3;
  (this->super_SAXException).fMemoryManager = manager;
  (this->super_SAXException)._vptr_SAXException = (_func_int **)&PTR__SAXParseException_0040bca8;
  iVar2 = (*locator->_vptr_Locator[5])(locator);
  this->fColumnNumber = CONCAT44(extraout_var_00,iVar2);
  iVar2 = (*locator->_vptr_Locator[4])(locator);
  this->fLineNumber = CONCAT44(extraout_var_01,iVar2);
  iVar2 = (*locator->_vptr_Locator[2])(locator);
  pvVar4 = (void *)CONCAT44(extraout_var_02,iVar2);
  if (pvVar4 == (void *)0x0) {
    pXVar3 = (XMLCh *)0x0;
  }
  else {
    sVar5 = 0;
    do {
      psVar1 = (short *)((long)pvVar4 + sVar5);
      sVar5 = sVar5 + 2;
    } while (*psVar1 != 0);
    iVar2 = (*manager->_vptr_MemoryManager[3])(manager,sVar5);
    pXVar3 = (XMLCh *)CONCAT44(extraout_var_03,iVar2);
    memcpy(pXVar3,pvVar4,sVar5);
  }
  this->fPublicId = pXVar3;
  iVar2 = (*locator->_vptr_Locator[3])(locator);
  pvVar4 = (void *)CONCAT44(extraout_var_04,iVar2);
  if (pvVar4 == (void *)0x0) {
    pXVar3 = (XMLCh *)0x0;
  }
  else {
    sVar5 = 0;
    do {
      psVar1 = (short *)((long)pvVar4 + sVar5);
      sVar5 = sVar5 + 2;
    } while (*psVar1 != 0);
    iVar2 = (*manager->_vptr_MemoryManager[3])(manager,sVar5);
    pXVar3 = (XMLCh *)CONCAT44(extraout_var_05,iVar2);
    memcpy(pXVar3,pvVar4,sVar5);
  }
  this->fSystemId = pXVar3;
  return;
}

Assistant:

SAXParseException::SAXParseException(const  XMLCh* const    message
                                    , const Locator&        locator
                                    , MemoryManager* const  manager) :
    SAXException(message, manager)
    , fColumnNumber(locator.getColumnNumber())
    , fLineNumber(locator.getLineNumber())
    , fPublicId(XMLString::replicate(locator.getPublicId(), manager))
    , fSystemId(XMLString::replicate(locator.getSystemId(), manager))
{
}